

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalyzedAssertion.cpp
# Opt level: O3

VisitResult * __thiscall
slang::analysis::ClockVisitor::visit
          (VisitResult *__return_storage_ptr__,ClockVisitor *this,AbortAssertionExpr *expr,
          Clock outerClock,bitmask<slang::analysis::VisitFlags> flags)

{
  VisitResult result;
  bitmask<slang::analysis::VisitFlags> local_5c;
  Clock local_58;
  VisitResult local_50;
  
  local_5c.m_bits = flags.m_bits;
  local_58 = outerClock;
  ast::AssertionExpr::
  visit<slang::analysis::ClockVisitor,slang::ast::TimingControl_const*&,slang::bitmask<slang::analysis::VisitFlags>&>
            (&local_50,expr->expr,this,&local_58,&local_5c);
  if (expr->isSync == false) {
    SmallVector<const_slang::ast::TimingControl_*,_2UL>::SmallVector
              (&__return_storage_ptr__->clocks,(Base *)&local_50);
    __return_storage_ptr__->isMulticlockedSeq = local_50.isMulticlockedSeq;
    __return_storage_ptr__->endClock = local_50.endClock;
  }
  else {
    inheritedClock(__return_storage_ptr__,this,&expr->super_AssertionExpr,local_58,local_5c);
  }
  if (local_50.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.data_ !=
      (pointer)local_50.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.firstElement
     ) {
    operator_delete(local_50.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.data_);
  }
  return __return_storage_ptr__;
}

Assistant:

VisitResult visit(const AbortAssertionExpr& expr, Clock outerClock, bitmask<VF> flags) {
        auto result = expr.expr.visit(*this, outerClock, flags);
        if (!expr.isSync)
            return result;
        return inheritedClock(expr, outerClock, flags);
    }